

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

char * __thiscall kj::Path::basename(Path *this,char *__filename)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  String *pSVar4;
  Fault f;
  Fault local_18;
  
  if (*(long *)(__filename + 8) != 0) {
    pSVar4 = (String *)
             _::HeapArrayDisposer::allocateImpl
                       (0x18,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    lVar2 = *(long *)__filename;
    lVar3 = *(long *)(__filename + 8);
    (pSVar4->content).ptr = *(char **)(lVar2 + -0x18 + lVar3 * 0x18);
    (pSVar4->content).size_ = *(size_t *)(lVar2 + -0x10 + lVar3 * 0x18);
    (pSVar4->content).disposer = *(ArrayDisposer **)(lVar2 + -8 + lVar3 * 0x18);
    puVar1 = (undefined8 *)(lVar2 + -0x18 + lVar3 * 0x18);
    *puVar1 = 0;
    puVar1[1] = 0;
    (this->parts).ptr = pSVar4;
    (this->parts).size_ = 1;
    (this->parts).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
    return (char *)this;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x74,FAILED,"parts.size() > 0","\"root path has no basename\"",
             (char (*) [26])"root path has no basename");
  _::Debug::Fault::fatal(&local_18);
}

Assistant:

Path Path::basename() && {
  KJ_REQUIRE(parts.size() > 0, "root path has no basename");
  auto newParts = kj::heapArrayBuilder<String>(1);
  newParts.add(kj::mv(parts[parts.size() - 1]));
  return Path(newParts.finish(), ALREADY_CHECKED);
}